

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42drivr.c
# Opt level: O0

FT_UInt t42_get_name_index(T42_Face face,FT_String *glyph_name)

{
  char *__s2;
  int iVar1;
  long lVar2;
  FT_String *gname;
  FT_Int i;
  FT_String *glyph_name_local;
  T42_Face face_local;
  
  gname._4_4_ = 0;
  while( true ) {
    if ((face->type1).num_glyphs <= gname._4_4_) {
      return 0;
    }
    __s2 = (face->type1).glyph_names[gname._4_4_];
    if ((*glyph_name == *__s2) && (iVar1 = strcmp(glyph_name,__s2), iVar1 == 0)) break;
    gname._4_4_ = gname._4_4_ + 1;
  }
  lVar2 = strtol((char *)(face->type1).charstrings[gname._4_4_],(char **)0x0,10);
  return (FT_UInt)lVar2;
}

Assistant:

static FT_UInt
  t42_get_name_index( T42_Face    face,
                      FT_String*  glyph_name )
  {
    FT_Int  i;


    for ( i = 0; i < face->type1.num_glyphs; i++ )
    {
      FT_String*  gname = face->type1.glyph_names[i];


      if ( glyph_name[0] == gname[0] && !ft_strcmp( glyph_name, gname ) )
        return (FT_UInt)ft_strtol( (const char *)face->type1.charstrings[i],
                                   NULL, 10 );
    }

    return 0;
  }